

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

char * Kit_PlaFromTruthNew(uint *pTruth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vStr)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ABC_UINT64_T AVar5;
  char *pcVar6;
  ABC_UINT64_T AVar7;
  int i;
  long lVar8;
  size_t sVar9;
  
  uVar3 = Kit_TruthIsop(pTruth,nVars,vCover,1);
  if (1 < uVar3) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x19b,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  iVar2 = vCover->nSize;
  if ((iVar2 != 0) && ((iVar2 != 1 || (*vCover->pArray != 0)))) {
    pcVar4 = Kit_PlaFromIsop(vStr,nVars,vCover);
    if (uVar3 != 0) {
      Kit_PlaComplement(pcVar4);
    }
    if (nVars < 6) {
      uVar3 = *pTruth;
      AVar5 = Kit_PlaToTruth6(pcVar4,nVars);
      if (uVar3 == (uint)AVar5) {
        return pcVar4;
      }
      __assert_fail("pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                    ,0x1a9,
                    "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
    }
    if (nVars != 6) {
      return pcVar4;
    }
    AVar5 = *(ABC_UINT64_T *)pTruth;
    AVar7 = Kit_PlaToTruth6(pcVar4,6);
    if (AVar5 == AVar7) {
      return pcVar4;
    }
    __assert_fail("*((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x1ab,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  if (uVar3 != 0) {
    __assert_fail("RetValue == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x19f,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  vStr->nSize = 0;
  pcVar4 = " 1\n";
  if (iVar2 == 0) {
    pcVar4 = " 0\n";
  }
  lVar8 = 0;
  do {
    cVar1 = pcVar4[lVar8];
    uVar3 = vStr->nCap;
    if (vStr->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar9 = 0x10;
      }
      else {
        sVar9 = (ulong)uVar3 * 2;
        if ((int)sVar9 <= (int)uVar3) goto LAB_005d8248;
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar9);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,sVar9);
        }
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar9;
    }
LAB_005d8248:
    iVar2 = vStr->nSize;
    vStr->nSize = iVar2 + 1;
    vStr->pArray[iVar2] = cVar1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar4;
      sVar9 = 0x10;
    }
    else {
      sVar9 = (ulong)uVar3 * 2;
      if ((int)sVar9 <= (int)uVar3) goto LAB_005d8317;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar9);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar9);
      }
      vStr->pArray = pcVar4;
    }
    vStr->nCap = (int)sVar9;
  }
LAB_005d8317:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = '\0';
  return vStr->pArray;
}

Assistant:

char * Kit_PlaFromTruthNew( unsigned * pTruth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vStr )
{
    char * pResult;
    // transform truth table into the SOP
    int RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        assert( RetValue == 0 );
        Vec_StrClear( vStr );
        Vec_StrAppend( vStr, (Vec_IntSize(vCover) == 0) ? " 0\n" : " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    pResult = Kit_PlaFromIsop( vStr, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pResult );
    if ( nVars < 6 )
        assert( pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars) );
    else if ( nVars == 6 )
        assert( *((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars) );
    return pResult;
}